

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_lib.cc
# Opt level: O3

void init_lib(module *m)

{
  class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *pcVar1;
  class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
  *pcVar2;
  code *local_158;
  undefined8 local_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  code *local_128;
  undefined8 local_120;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  undefined8 local_100;
  code *local_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  handle local_28;
  module_ lib_m;
  class_<kratos::asic::SRAM,_std::shared_ptr<kratos::asic::SRAM>,_kratos::Generator> sram;
  class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
  single_sram;
  
  pybind11::module_::def_submodule((module_ *)&local_28,(char *)m,"lib");
  pybind11::class_<kratos::asic::SRAM,_std::shared_ptr<kratos::asic::SRAM>,_kratos::Generator>::
  class_<>((class_<kratos::asic::SRAM,_std::shared_ptr<kratos::asic::SRAM>,_kratos::Generator> *)
           &lib_m,local_28,"SRAM");
  local_48 = (code *)0x41;
  local_40 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property_readonly<unsigned_int(kratos::asic::SRAM::*)()>
                     ((class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>
                       *)&lib_m,"num_ports",(offset_in_Var_to_subr *)&local_48);
  local_38 = kratos::asic::SRAM::clock;
  local_30 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SRAM::*)()>
                     (pcVar1,"clock",(offset_in_Var_to_subr *)&local_38);
  local_98 = kratos::asic::SRAM::addr_width;
  local_90 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property_readonly<unsigned_short(kratos::asic::SRAM::*)()>
                     (pcVar1,"addr_width",(offset_in_Var_to_subr *)&local_98);
  local_88 = kratos::asic::SRAM::data_width;
  local_80 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property_readonly<unsigned_short(kratos::asic::SRAM::*)()>
                     (pcVar1,"data_width",(offset_in_Var_to_subr *)&local_88);
  local_78 = kratos::asic::SRAM::clock_name_abi_cxx11_;
  local_70 = 0;
  local_68 = kratos::asic::SRAM::set_clock_name;
  local_60 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property<std::__cxx11::string(kratos::asic::SRAM::*)()const,void(kratos::asic::SRAM::*)(std::__cxx11::string_const&)>
                     (pcVar1,"clock_name",(offset_in_Var_to_subr *)&local_78,
                      (offset_in_Var_to_subr *)&local_68);
  local_58 = kratos::asic::SRAM::capacity;
  local_50 = 0;
  pybind11::class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
  def<unsigned_int(kratos::asic::SRAM::*)()const>
            (pcVar1,"capacity",(offset_in_Var_to_subr *)&local_58);
  pybind11::
  class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
  ::class_<>((class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
              *)&sram,local_28,"SinglePortSRAM");
  pybind11::
  class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
              *)&sram,"__init__",(type *)&local_48,(is_new_style_constructor *)&local_38);
  pybind11::
  class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
              *)&sram,"__init__",(type *)&local_48,(is_new_style_constructor *)&local_38);
  local_48 = kratos::asic::SinglePortSRAM::output_data;
  local_40 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        ((class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
                          *)&sram,"output_data",(offset_in_Var_to_subr *)&local_48);
  local_38 = kratos::asic::SinglePortSRAM::chip_enable;
  local_30 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"chip_enable",(offset_in_Var_to_subr *)&local_38);
  local_98 = kratos::asic::SinglePortSRAM::write_enable;
  local_90 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"write_enable",(offset_in_Var_to_subr *)&local_98);
  local_88 = kratos::asic::SinglePortSRAM::addr;
  local_80 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"addr",(offset_in_Var_to_subr *)&local_88);
  local_78 = kratos::asic::SinglePortSRAM::input_data;
  local_70 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"input_data",(offset_in_Var_to_subr *)&local_78);
  local_68 = kratos::asic::SinglePortSRAM::partial_write_mask;
  local_60 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"partial_write_mask",(offset_in_Var_to_subr *)&local_68);
  local_58 = kratos::asic::SinglePortSRAM::output_data_name_abi_cxx11_;
  local_50 = 0;
  local_158 = kratos::asic::SinglePortSRAM::set_output_data_name;
  local_150 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"output_data_name",(offset_in_Var_to_subr *)&local_58,
                         (offset_in_Var_to_subr *)&local_158);
  local_148 = kratos::asic::SinglePortSRAM::chip_enable_name_abi_cxx11_;
  local_140 = 0;
  local_138 = kratos::asic::SinglePortSRAM::set_chip_enable_name;
  local_130 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"chip_enable_name",(offset_in_Var_to_subr *)&local_148,
                         (offset_in_Var_to_subr *)&local_138);
  local_128 = kratos::asic::SinglePortSRAM::write_enable_name_abi_cxx11_;
  local_120 = 0;
  local_118 = kratos::asic::SinglePortSRAM::set_write_enable_name;
  local_110 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"write_enable_name",(offset_in_Var_to_subr *)&local_128,
                         (offset_in_Var_to_subr *)&local_118);
  local_108 = kratos::asic::SinglePortSRAM::addr_name_abi_cxx11_;
  local_100 = 0;
  local_f8 = kratos::asic::SinglePortSRAM::set_addr_name;
  local_f0 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"addr_name",(offset_in_Var_to_subr *)&local_108,
                         (offset_in_Var_to_subr *)&local_f8);
  local_e8 = kratos::asic::SinglePortSRAM::input_data_name_abi_cxx11_;
  local_e0 = 0;
  local_d8 = kratos::asic::SinglePortSRAM::set_input_data_name;
  local_d0 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"input_data_name",(offset_in_Var_to_subr *)&local_e8,
                         (offset_in_Var_to_subr *)&local_d8);
  local_c8 = kratos::asic::SinglePortSRAM::partial_write_mask_name_abi_cxx11_;
  local_c0 = 0;
  local_b8 = kratos::asic::SinglePortSRAM::set_partial_write_mask_name;
  local_b0 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"partial_write_mask_name",(offset_in_Var_to_subr *)&local_c8,
                         (offset_in_Var_to_subr *)&local_b8);
  local_a8 = kratos::asic::SinglePortSRAM::partial_write;
  local_a0 = 0;
  pybind11::
  class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
  ::def_property_readonly<bool(kratos::asic::SinglePortSRAM::*)()const>
            (pcVar2,"partial_write",(offset_in_Var_to_subr *)&local_a8);
  pybind11::object::~object((object *)&sram);
  pybind11::object::~object(&lib_m.super_object);
  pybind11::object::~object((object *)&local_28);
  return;
}

Assistant:

void init_lib(py::module &m) {
    using namespace kratos;
    using namespace kratos::asic;
    // sub module
    auto lib_m = m.def_submodule("lib");

    // define sram
    auto sram = py::class_<SRAM, std::shared_ptr<SRAM>, Generator>(lib_m, "SRAM");
    sram.def_property_readonly("num_ports", &SRAM::num_ports)
        .def_property_readonly("clock", &SRAM::clock)
        .def_property_readonly("addr_width", &SRAM::addr_width)
        .def_property_readonly("data_width", &SRAM::data_width)
        .def_property("clock_name", &SRAM::clock_name, &SRAM::set_clock_name)
        .def("capacity", &SRAM::capacity);

    // define single port sram
    auto single_sram =
        py::class_<SinglePortSRAM, std::shared_ptr<SinglePortSRAM>, SRAM>(lib_m, "SinglePortSRAM");
    single_sram.def(py::init<Context *, const std::string &, uint16_t, uint16_t, bool>())
        .def(
            py::init<Context *, const std::string &, uint32_t, std::shared_ptr<SinglePortSRAM> &>())
        .def_property_readonly("output_data", &SinglePortSRAM::output_data)
        .def_property_readonly("chip_enable", &SinglePortSRAM::chip_enable)
        .def_property_readonly("write_enable", &SinglePortSRAM::write_enable)
        .def_property_readonly("addr", &SinglePortSRAM::addr)
        .def_property_readonly("input_data", &SinglePortSRAM::input_data)
        .def_property_readonly("partial_write_mask", &SinglePortSRAM::partial_write_mask)
        .def_property("output_data_name", &SinglePortSRAM::output_data_name,
                      &SinglePortSRAM::set_output_data_name)
        .def_property("chip_enable_name", &SinglePortSRAM::chip_enable_name,
                      &SinglePortSRAM::set_chip_enable_name)
        .def_property("write_enable_name", &SinglePortSRAM::write_enable_name,
                      &SinglePortSRAM::set_write_enable_name)
        .def_property("addr_name", &SinglePortSRAM::addr_name, &SinglePortSRAM::set_addr_name)
        .def_property("input_data_name", &SinglePortSRAM::input_data_name,
                      &SinglePortSRAM::set_input_data_name)
        .def_property("partial_write_mask_name", &SinglePortSRAM::partial_write_mask_name,
                      &SinglePortSRAM::set_partial_write_mask_name)
        .def_property_readonly("partial_write", &SinglePortSRAM::partial_write);
}